

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_voxels.cpp
# Opt level: O0

uint __thiscall FVoxelModel::AddVertex(FVoxelModel *this,FModelVertex *vert,FVoxelMap *check)

{
  uint *puVar1;
  uint local_24;
  uint index;
  FVoxelMap *check_local;
  FModelVertex *vert_local;
  FVoxelModel *this_local;
  
  puVar1 = TMap<FModelVertex,_unsigned_int,_FVoxelVertexHash,_FIndexInit>::operator[](check,*vert);
  local_24 = *puVar1;
  if (local_24 == 0xffffffff) {
    local_24 = TArray<FModelVertex,_FModelVertex>::Push(&this->mVertices,vert);
    puVar1 = TMap<FModelVertex,_unsigned_int,_FVoxelVertexHash,_FIndexInit>::operator[](check,*vert)
    ;
    *puVar1 = local_24;
  }
  return local_24;
}

Assistant:

unsigned int FVoxelModel::AddVertex(FModelVertex &vert, FVoxelMap &check)
{
	unsigned int index = check[vert];
	if (index == 0xffffffff)
	{
		index = check[vert] =mVertices.Push(vert);
	}
	return index;
}